

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_start.c
# Opt level: O0

void * thread_monitor(void *p)

{
  int iVar1;
  int iVar2;
  int local_1c;
  int n;
  int i;
  monitor *m;
  void *p_local;
  
  iVar1 = *p;
  skynet_initthread(4);
  while (iVar2 = skynet_context_total(), iVar2 != 0) {
    for (local_1c = 0; local_1c < iVar1; local_1c = local_1c + 1) {
      skynet_monitor_check(*(skynet_monitor **)(*(long *)((long)p + 8) + (long)local_1c * 8));
    }
    local_1c = 0;
    while ((local_1c < 5 && (iVar2 = skynet_context_total(), iVar2 != 0))) {
      sleep(1);
      local_1c = local_1c + 1;
    }
  }
  return (void *)0x0;
}

Assistant:

static void *
thread_monitor(void *p) {
	struct monitor * m = p;
	int i;
	int n = m->count;
	skynet_initthread(THREAD_MONITOR);
	for (;;) {
		CHECK_ABORT
		for (i=0;i<n;i++) {
			skynet_monitor_check(m->m[i]);
		}
		for (i=0;i<5;i++) {
			CHECK_ABORT
			sleep(1);
		}
	}

	return NULL;
}